

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

int QUtf8::compareUtf8(QByteArrayView lhs,QByteArrayView rhs,CaseSensitivity cs)

{
  size_t __n;
  bool bVar1;
  char32_t cVar2;
  char32_t cVar3;
  size_t *psVar4;
  const_pointer pvVar5;
  const_pointer pvVar6;
  qsizetype qVar7;
  qsizetype rhs_00;
  int in_R8D;
  long in_FS_OFFSET;
  qsizetype res;
  uchar b;
  uchar *end2;
  uchar *end1;
  int r;
  longlong l;
  char32_t *output;
  uchar *src2;
  char32_t uc2;
  uchar *src1;
  char32_t uc1;
  uchar *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  char32_t **in_stack_ffffffffffffff60;
  qsizetype in_stack_ffffffffffffff68;
  int local_64;
  const_pointer local_58;
  const_pointer local_48;
  qsizetype local_38;
  qsizetype local_30;
  QByteArrayView local_28;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QByteArrayView::isEmpty((QByteArrayView *)0x16777e);
  if (bVar1) {
    qVar7 = QByteArrayView::size(&local_28);
    local_64 = QtMiscUtils::qt_lencmp(0,qVar7);
  }
  else if (in_R8D == 1) {
    local_30 = QByteArrayView::size(&local_18);
    local_38 = QByteArrayView::size(&local_28);
    psVar4 = (size_t *)std::min<long_long>(&local_30,&local_38);
    __n = *psVar4;
    pvVar5 = QByteArrayView::data(&local_18);
    pvVar6 = QByteArrayView::data(&local_28);
    local_64 = memcmp(pvVar5,pvVar6,__n);
    if (local_64 == 0) {
      qVar7 = QByteArrayView::size(&local_18);
      rhs_00 = QByteArrayView::size(&local_28);
      local_64 = QtMiscUtils::qt_lencmp(qVar7,rhs_00);
    }
  }
  else {
    local_48 = QByteArrayView::data(&local_18);
    qVar7 = QByteArrayView::size(&local_18);
    pvVar5 = local_48 + qVar7;
    local_58 = QByteArrayView::data(&local_28);
    qVar7 = QByteArrayView::size(&local_28);
    pvVar6 = local_58 + qVar7;
    do {
      if (pvVar5 <= local_48 || pvVar6 <= local_58) {
        local_64 = (uint)(local_48 < pvVar5) - (uint)(local_58 < pvVar6);
        goto LAB_00167a5b;
      }
      local_48 = local_48 + 1;
      qVar7 = QUtf8Functions::fromUtf8<QUtf8BaseTraits,char32_t*,unsigned_char_const*>
                        ((uchar)((ulong)in_stack_ffffffffffffff68 >> 0x38),in_stack_ffffffffffffff60
                         ,(uchar **)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                         in_stack_ffffffffffffff50);
      local_58 = local_58 + 1;
      in_stack_ffffffffffffff68 =
           QUtf8Functions::fromUtf8<QUtf8BaseTraits,char32_t*,unsigned_char_const*>
                     ((uchar)((ulong)qVar7 >> 0x38),in_stack_ffffffffffffff60,
                      (uchar **)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                      in_stack_ffffffffffffff50);
      cVar2 = QChar::toCaseFolded(L'\x001679f6');
      cVar3 = QChar::toCaseFolded(L'\x00167a06');
    } while (cVar2 == cVar3);
    local_64 = cVar2 - cVar3;
  }
LAB_00167a5b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_64;
  }
  __stack_chk_fail();
}

Assistant:

int QUtf8::compareUtf8(QByteArrayView lhs, QByteArrayView rhs, Qt::CaseSensitivity cs) noexcept
{
    if (lhs.isEmpty())
        return qt_lencmp(0, rhs.size());

    if (cs == Qt::CaseSensitive) {
        const auto l = std::min(lhs.size(), rhs.size());
        int r = memcmp(lhs.data(), rhs.data(), l);
        return r ? r : qt_lencmp(lhs.size(), rhs.size());
    }

    char32_t uc1 = QChar::Null;
    auto src1 = reinterpret_cast<const uchar *>(lhs.data());
    auto end1 = src1 + lhs.size();
    char32_t uc2 = QChar::Null;
    auto src2 = reinterpret_cast<const uchar *>(rhs.data());
    auto end2 = src2 + rhs.size();

    while (src1 < end1 && src2 < end2) {
        uchar b = *src1++;
        char32_t *output = &uc1;
        qsizetype res = QUtf8Functions::fromUtf8<QUtf8BaseTraits>(b, output, src1, end1);
        if (res < 0) {
            // decoding error
            uc1 = QChar::ReplacementCharacter;
        }

        b = *src2++;
        output = &uc2;
        res = QUtf8Functions::fromUtf8<QUtf8BaseTraits>(b, output, src2, end2);
        if (res < 0) {
            // decoding error
            uc2 = QChar::ReplacementCharacter;
        }

        uc1 = QChar::toCaseFolded(uc1);
        uc2 = QChar::toCaseFolded(uc2);
        if (uc1 != uc2)
            return int(uc1) - int(uc2);
    }

    // the shorter string sorts first
    return (end1 > src1) - (end2 > src2);
}